

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::PopulateTcParseEntries
          (Reflection *this,TailCallTableInfo *table_info,FieldEntry *entries)

{
  long lVar1;
  pointer pFVar2;
  pointer pFVar3;
  FieldDescriptor *field;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  OneofDescriptor *pOVar7;
  
  pFVar2 = (table_info->field_entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (table_info->field_entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar2 != pFVar3) {
    lVar6 = 0;
    do {
      field = *(FieldDescriptor **)((long)&pFVar2->field + lVar6 * 2);
      if ((field->field_0x3 & 1) == 0) {
        pOVar7 = (OneofDescriptor *)0x0;
      }
      else {
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar7 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar7 = (field->scope_).containing_oneof;
          if (pOVar7 == (OneofDescriptor *)0x0) {
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        if (pOVar7 == (OneofDescriptor *)0x0) {
LAB_001fa2ad:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb63);
        }
        if ((pOVar7->field_count_ == 1) && ((pOVar7->fields_->field_0x1 & 2) != 0)) {
          PopulateTcParseEntries();
          goto LAB_001fa2ad;
        }
      }
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(uint32_t *)((long)&entries->offset + lVar6) = uVar4;
      if (pOVar7 == (OneofDescriptor *)0x0) {
        if ((this->schema_).has_bits_offset_ == -1) {
          iVar5 = 0;
        }
        else {
          uVar4 = internal::ReflectionSchema::HasBitsOffset(&this->schema_);
          iVar5 = uVar4 * 8 + *(int *)((long)&pFVar2->hasbit_idx + lVar6 * 2);
        }
      }
      else {
        iVar5 = (int)((ulong)((long)pOVar7 - (long)pOVar7->containing_type_->oneof_decls_) >> 3) *
                -0x24924924 + (this->schema_).oneof_case_offset_;
      }
      lVar1 = lVar6 * 2;
      *(int *)((long)&entries->has_idx + lVar6) = iVar5;
      *(uint16_t *)((long)&entries->aux_idx + lVar6) = (&pFVar2->aux_idx)[lVar6];
      *(uint16_t *)((long)&entries->type_card + lVar6) = (&pFVar2->type_card)[lVar6];
      lVar6 = lVar6 + 0xc;
    } while ((pointer)((long)&pFVar2[1].field + lVar1) != pFVar3);
  }
  return;
}

Assistant:

void Reflection::PopulateTcParseEntries(
    internal::TailCallTableInfo& table_info,
    TcParseTableBase::FieldEntry* entries) const {
  for (const auto& entry : table_info.field_entries) {
    const FieldDescriptor* field = entry.field;
    const OneofDescriptor* oneof = field->real_containing_oneof();
    entries->offset = schema_.GetFieldOffset(field);
    if (oneof != nullptr) {
      entries->has_idx = schema_.oneof_case_offset_ + 4 * oneof->index();
    } else if (schema_.HasHasbits()) {
      entries->has_idx =
          static_cast<int>(8 * schema_.HasBitsOffset() + entry.hasbit_idx);
    } else {
      entries->has_idx = 0;
    }
    entries->aux_idx = entry.aux_idx;
    entries->type_card = entry.type_card;
    ++entries;
  }
}